

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_grow(REF_GEOM ref_geom)

{
  int iVar1;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  int local_30;
  int local_2c;
  REF_INT max_limit;
  REF_INT chunk;
  REF_INT orig;
  REF_INT geom;
  REF_GEOM ref_geom_local;
  
  if (ref_geom->blank == -1) {
    if (ref_geom->max == 0x2aaaaaaa) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1d6,
             "ref_geom_grow","the number of geoms is too large for integers, cannot grow");
      ref_geom_local._4_4_ = 1;
    }
    else {
      iVar1 = ref_geom->max;
      if ((int)((double)iVar1 * 1.5) < 1000) {
        local_2c = 1000;
      }
      else {
        local_2c = (int)((double)iVar1 * 1.5);
      }
      if (0x2aaaaaaa - iVar1 < 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x1dc,"ref_geom_grow","chunk limit at max");
        ref_geom_local._4_4_ = 1;
      }
      else {
        if (local_2c < 0x2aaaaaaa - iVar1) {
          local_30 = local_2c;
        }
        else {
          local_30 = 0x2aaaaaaa - iVar1;
        }
        ref_geom->max = iVar1 + local_30;
        fflush(_stdout);
        if (0 < ref_geom->max * 6) {
          pRVar2 = (REF_INT *)realloc(ref_geom->descr,(long)(ref_geom->max * 6) << 2);
          ref_geom->descr = pRVar2;
        }
        if (ref_geom->descr == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x1e2,"ref_geom_grow","realloc ref_geom->descr NULL");
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
                 (ulong)(uint)(ref_geom->max * 6),(long)(ref_geom->max * 6),4,
                 (long)(ref_geom->max * 6) << 2);
          ref_geom_local._4_4_ = 2;
        }
        else {
          fflush(_stdout);
          if (ref_geom->max * -2 < 0) {
            pRVar3 = (REF_DBL *)realloc(ref_geom->param,(long)(ref_geom->max << 1) << 3);
            ref_geom->param = pRVar3;
          }
          chunk = iVar1;
          if (ref_geom->param == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1e3,"ref_geom_grow","realloc ref_geom->param NULL");
            printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
                   (ulong)(uint)(ref_geom->max << 1),(long)(ref_geom->max << 1),8,
                   (long)(ref_geom->max << 1) << 3);
            ref_geom_local._4_4_ = 2;
          }
          else {
            for (; chunk < ref_geom->max; chunk = chunk + 1) {
              ref_geom->descr[chunk * 6] = -1;
              ref_geom->descr[chunk * 6 + 1] = chunk + 1;
            }
            ref_geom->descr[(ref_geom->max + -1) * 6 + 1] = -1;
            ref_geom->blank = iVar1;
            ref_geom_local._4_4_ = 0;
          }
        }
      }
    }
  }
  else {
    ref_geom_local._4_4_ = 0;
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_grow(REF_GEOM ref_geom) {
  REF_INT geom;
  REF_INT orig, chunk;
  REF_INT max_limit = REF_INT_MAX / 3;

  if (REF_EMPTY != ref_geom_blank(ref_geom)) {
    return REF_SUCCESS;
  }

  RAS(ref_geom_max(ref_geom) != max_limit,
      "the number of geoms is too large for integers, cannot grow");
  orig = ref_geom_max(ref_geom);
  /* geometric growth for efficiency */
  chunk = MAX(1000, (REF_INT)(1.5 * (REF_DBL)orig));

  /* try to keep under 32-bit limit */
  RAS(max_limit - orig > 0, "chunk limit at max");
  chunk = MIN(chunk, max_limit - orig);

  ref_geom_max(ref_geom) = orig + chunk;

  ref_realloc(ref_geom->descr, REF_GEOM_DESCR_SIZE * ref_geom_max(ref_geom),
              REF_INT);
  ref_realloc(ref_geom->param, 2 * ref_geom_max(ref_geom), REF_DBL);

  for (geom = orig; geom < ref_geom_max(ref_geom); geom++) {
    ref_geom_type(ref_geom, geom) = REF_EMPTY;
    ref_geom_id(ref_geom, geom) = geom + 1;
  }
  ref_geom_id(ref_geom, ref_geom_max(ref_geom) - 1) = REF_EMPTY;
  ref_geom_blank(ref_geom) = orig;

  return REF_SUCCESS;
}